

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

void __thiscall cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,string *base58_data)

{
  ByteData256 local_30;
  
  ByteData256::ByteData256(&local_30);
  ExtPubkey(this,base58_data,&local_30);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ExtPubkey::ExtPubkey(const std::string& base58_data)
    : ExtPubkey(base58_data, ByteData256()) {
  // do nothing
}